

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hooks.c
# Opt level: O3

int scandirat(int dirfd,char *dirp,dirent ***namelist,_func_int_dirent_ptr *filter,
             _func_int_dirent_ptr_ptr_dirent_ptr_ptr *compar)

{
  int iVar1;
  code *pcVar2;
  char *__ptr;
  
  pcVar2 = (code *)dlsym(0xffffffffffffffff,"scandirat");
  __ptr = apprun_redirect_path_if_absolute(dirp);
  iVar1 = (*pcVar2)(dirfd,__ptr,namelist,filter,compar);
  free(__ptr);
  return iVar1;
}

Assistant:

int
scandirat(int dirfd, const char *dirp, struct dirent ***namelist, int (*filter)(const struct dirent *),
          int (*compar)(const struct dirent **, const struct dirent **)) {
    int (*_scandirat)(int dirfd, const char *dirp, struct dirent ***namelist, int (*filter)(const struct dirent *),
                      int (*compar)(const struct dirent **, const struct dirent **));
    char *new_path = NULL;
    int ret;

    _scandirat = (int (*)(int dirfd, const char *dirp, struct dirent ***namelist, int (*filter)(const struct dirent *),
                          int (*compar)(const struct dirent **, const struct dirent **))) dlsym(RTLD_NEXT, "scandirat");

    new_path = apprun_redirect_path_if_absolute(dirp);
    ret = _scandirat(dirfd, new_path, namelist, filter, compar);
    free(new_path);

    return ret;
}